

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# detail_primitive_types.h
# Opt level: O3

shared_ptr<DogPrimitive> __thiscall
dukglue::types::DukType<std::shared_ptr<DogPrimitive>>::read<std::shared_ptr<DogPrimitive>>
          (DukType<std::shared_ptr<DogPrimitive>> *this,duk_context *ctx,duk_idx_t arg_idx)

{
  long lVar1;
  bool bVar2;
  duk_bool_t dVar3;
  TypeInfo *this_00;
  undefined8 *puVar4;
  duk_int_t line;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  char *fmt;
  shared_ptr<DogPrimitive> sVar6;
  
  dVar3 = duk_is_null(ctx,arg_idx);
  if (dVar3 != 0) {
    *(undefined8 *)this = 0;
    *(undefined8 *)(this + 8) = 0;
    _Var5._M_pi = extraout_RDX;
LAB_0011d7f8:
    sVar6.super___shared_ptr<DogPrimitive,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         _Var5._M_pi;
    sVar6.super___shared_ptr<DogPrimitive,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
    ;
    return (shared_ptr<DogPrimitive>)
           sVar6.super___shared_ptr<DogPrimitive,_(__gnu_cxx::_Lock_policy)2>;
  }
  dVar3 = duk_is_object(ctx,arg_idx);
  if (dVar3 == 0) {
    duk_get_type(ctx,arg_idx);
    fmt = "Argument %d: expected shared_ptr object, got ";
    line = 0xbc;
  }
  else {
    duk_get_prop_string(ctx,arg_idx,anon_var_dwarf_f37f);
    dVar3 = duk_is_pointer(ctx,-1);
    if (dVar3 == 0) {
      fmt = "Argument %d: expected shared_ptr object (missing type_info)";
      line = 0xc1;
    }
    else {
      this_00 = (TypeInfo *)duk_get_pointer(ctx,-1);
      bVar2 = detail::TypeInfo::can_cast<DogPrimitive>(this_00);
      if (bVar2) {
        duk_pop(ctx);
        duk_get_prop_string(ctx,arg_idx,anon_var_dwarf_3e1c6);
        dVar3 = duk_is_pointer(ctx,-1);
        if (dVar3 != 0) {
          puVar4 = (undefined8 *)duk_get_pointer(ctx,-1);
          duk_pop(ctx);
          *(undefined8 *)this = *puVar4;
          lVar1 = puVar4[1];
          *(long *)(this + 8) = lVar1;
          _Var5._M_pi = extraout_RDX_00;
          if (lVar1 != 0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(int *)(lVar1 + 8) = *(int *)(lVar1 + 8) + 1;
              UNLOCK();
            }
            else {
              *(int *)(lVar1 + 8) = *(int *)(lVar1 + 8) + 1;
            }
          }
          goto LAB_0011d7f8;
        }
        fmt = "Argument %d: not a shared_ptr object (missing shared_ptr)";
        line = 0xcb;
      }
      else {
        fmt = "Argument %d: wrong type of shared_ptr object";
        line = 0xc6;
      }
    }
  }
  duk_error_raw(ctx,-6,
                "/workspace/llm4binary/github/license_c_cmakelists/Aloshi[P]dukglue/tests/../include/dukglue/detail_primitive_types.h"
                ,line,fmt,(ulong)(uint)arg_idx);
}

Assistant:

static std::shared_ptr<T> read(duk_context* ctx, duk_idx_t arg_idx) {
				if (duk_is_null(ctx, arg_idx))
					return nullptr;

				if (!duk_is_object(ctx, arg_idx)) {
					duk_int_t type_idx = duk_get_type(ctx, arg_idx);
					duk_error(ctx, DUK_RET_TYPE_ERROR, "Argument %d: expected shared_ptr object, got ", arg_idx, detail::get_type_name(type_idx));
				}

				duk_get_prop_string(ctx, arg_idx, "\xFF" "type_info");
				if (!duk_is_pointer(ctx, -1))  // missing type_info, must not be a native object
					duk_error(ctx, DUK_RET_TYPE_ERROR, "Argument %d: expected shared_ptr object (missing type_info)", arg_idx);

				// make sure this object can be safely returned as a T*
				dukglue::detail::TypeInfo* info = static_cast<dukglue::detail::TypeInfo*>(duk_get_pointer(ctx, -1));
				if (!info->can_cast<T>())
					duk_error(ctx, DUK_RET_TYPE_ERROR, "Argument %d: wrong type of shared_ptr object", arg_idx);
				duk_pop(ctx);  // pop type_info

				duk_get_prop_string(ctx, arg_idx, "\xFF" "shared_ptr");
				if (!duk_is_pointer(ctx, -1))
					duk_error(ctx, DUK_RET_TYPE_ERROR, "Argument %d: not a shared_ptr object (missing shared_ptr)", arg_idx);
				void* ptr = duk_get_pointer(ctx, -1);
				duk_pop(ctx);  // pop pointer to shared_ptr

				return *((std::shared_ptr<T>*) ptr);
			}